

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O0

pair<pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::internal_node::lookup(internal_node *this,hash_type hash_index)

{
  uint uVar1;
  index_pointer local_40;
  ulong local_38;
  size_t index;
  hash_type bit_pos;
  hash_type hash_index_local;
  internal_node *this_local;
  
  bit_pos = hash_index;
  hash_index_local = (hash_type)this;
  if (hash_index < 0x40) {
    index = 1L << ((byte)hash_index & 0x3f);
    if ((this->bitmap_ & index) == 0) {
      index_pointer::index_pointer((index_pointer *)&local_40.addr_);
      std::pair<pstore::index::details::index_pointer,_unsigned_long>::
      pair<pstore::index::details::index_pointer,_true>
                ((pair<pstore::index::details::index_pointer,_unsigned_long> *)&this_local,&local_40
                 ,&not_found);
    }
    else {
      uVar1 = bit_count::pop_count(this->bitmap_ & index - 1);
      local_38 = (ulong)uVar1;
      std::pair<pstore::index::details::index_pointer,_unsigned_long>::
      pair<pstore::index::details::index_pointer,_unsigned_long,_true>
                ((pair<pstore::index::details::index_pointer,_unsigned_long> *)&this_local,
                 this->children_ + local_38,&local_38);
    }
    return _this_local;
  }
  assert_failed("hash_index < (hash_type{1} << hash_index_bits)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0x2d5);
}

Assistant:

inline auto internal_node::lookup (hash_type const hash_index) const
                -> std::pair<index_pointer, std::size_t> {
                PSTORE_ASSERT (hash_index < (hash_type{1} << hash_index_bits));
                auto const bit_pos = hash_type{1} << hash_index;
                if ((bitmap_ & bit_pos) != 0) { //! OCLINT(PH - bitwise in conditional is ok)
                    std::size_t const index = bit_count::pop_count (bitmap_ & (bit_pos - 1U));
                    return {children_[index], index};
                }
                return {index_pointer{}, not_found};
            }